

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O3

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::BinaryDeserializer::Deserialize<duckdb::ExtensionInstallInfo>
          (BinaryDeserializer *this,ReadStream *stream)

{
  BinaryDeserializer deserializer;
  Deserializer local_2b0;
  ReadStream *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined2 local_26;
  
  local_2b0._vptr_Deserializer = (_func_int **)&PTR__Deserializer_01967a98;
  local_2b0.deserialize_enum_from_string = false;
  SerializationData::SerializationData(&local_2b0.data);
  local_2b0._vptr_Deserializer = (_func_int **)&PTR__Deserializer_019678f8;
  local_30 = 0;
  local_28 = 0;
  local_26 = 0;
  local_2b0.deserialize_enum_from_string = false;
  local_38 = stream;
  Deserialize<duckdb::ExtensionInstallInfo>(this);
  Deserializer::~Deserializer(&local_2b0);
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )this;
}

Assistant:

static unique_ptr<T> Deserialize(ReadStream &stream) {
		BinaryDeserializer deserializer(stream);
		return deserializer.template Deserialize<T>();
	}